

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **end;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t max;
  allocator local_b9;
  string user_max_report;
  string local_98;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> repeats;
  string sequence;
  string local_40;
  
  sequence._M_dataplus._M_p = (pointer)&sequence.field_2;
  sequence._M_string_length = 0;
  sequence.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&sequence);
  capitalise<std::__cxx11::string>(&sequence);
  bVar1 = is_dna<std::__cxx11::string>(&sequence);
  if (!bVar1) {
    bVar1 = is_rna<std::__cxx11::string>(&sequence);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"this example is only for DNA or RNA sequences"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      exit(0);
    }
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&sequence);
  get_repeats(&repeats,&local_40,true);
  std::__cxx11::string::~string((string *)&local_40);
  poVar3 = std::operator<<((ostream *)&std::clog,"Found ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," tandem repeats!");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string((string *)&user_max_report,"-a",(allocator *)&local_98);
  end = argv + argc;
  bVar1 = cmd_option_exists(argv,end,&user_max_report);
  std::__cxx11::string::~string((string *)&user_max_report);
  if (bVar1) {
    std::__cxx11::string::string((string *)&user_max_report,"-c",(allocator *)&local_98);
    bVar1 = cmd_option_exists(argv,end,&user_max_report);
    std::__cxx11::string::~string((string *)&user_max_report);
    if (bVar1) {
      print_csv_format<__gnu_cxx::__normal_iterator<tandem::Repeat_const*,std::vector<tandem::Repeat,std::allocator<tandem::Repeat>>>>
                ((__normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                  )repeats.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_tandem::Repeat_*,_std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>
                  )repeats.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&sequence);
    }
    else {
      print((RepeatIterator)
            repeats.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>._M_impl.
            super__Vector_impl_data._M_start,
            (RepeatIterator)
            repeats.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>._M_impl.
            super__Vector_impl_data._M_finish,&sequence);
    }
  }
  else {
    std::__cxx11::string::string((string *)&user_max_report,"-n",(allocator *)&local_98);
    bVar1 = cmd_option_exists(argv,end,&user_max_report);
    std::__cxx11::string::~string((string *)&user_max_report);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_98,"-n",&local_b9);
      get_cmd_option(&user_max_report,argv,end,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      max = std::__cxx11::stoull(&user_max_report,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&user_max_report);
    }
    else {
      max = 10;
    }
    std::__cxx11::string::string((string *)&user_max_report,"-p",(allocator *)&local_98);
    bVar1 = cmd_option_exists(argv,end,&user_max_report);
    std::__cxx11::string::~string((string *)&user_max_report);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_98,"-p",&local_b9);
      get_cmd_option(&user_max_report,argv,end,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      iVar2 = std::__cxx11::stoi(&user_max_report,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&user_max_report);
    }
    else {
      iVar2 = -1;
    }
    report_biggest_periods(&repeats,&sequence,max,iVar2);
    std::__cxx11::string::string((string *)&user_max_report,"-l",(allocator *)&local_98);
    bVar1 = cmd_option_exists(argv,end,&user_max_report);
    std::__cxx11::string::~string((string *)&user_max_report);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_98,"-l",&local_b9);
      get_cmd_option(&user_max_report,argv,end,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      iVar2 = std::__cxx11::stoi(&user_max_report,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&user_max_report);
    }
    else {
      iVar2 = -1;
    }
    report_biggest_lengths(&repeats,&sequence,max,iVar2);
  }
  std::_Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>::~_Vector_base
            (&repeats.super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>);
  std::__cxx11::string::~string((string *)&sequence);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string sequence;
    std::getline(std::cin, sequence);
    capitalise(sequence);
    if (!is_dna(sequence) && !is_rna(sequence)) {
        std::cerr << "this example is only for DNA or RNA sequences" << std::endl;
        exit(0);
    }
    auto repeats = get_repeats(sequence);
    std::clog << "Found " << repeats.size() << " tandem repeats!" << std::endl;
    if (cmd_option_exists(argv, argv + argc, "-a")) {
        if (cmd_option_exists(argv, argv + argc, "-c")) {
            print_csv_format(std::cbegin(repeats), std::cend(repeats), sequence);
        } else {
            print(std::begin(repeats), std::end(repeats), sequence);
        }
    } else {
        std::size_t max_report {10};
        if (cmd_option_exists(argv, argv + argc, "-n")) {
            const std::string user_max_report {get_cmd_option(argv, argv + argc, "-n")};
            max_report = std::stoull(user_max_report);
        }
        int min_period {-1};
        if (cmd_option_exists(argv, argv + argc, "-p")) {
            const std::string user_min_period {get_cmd_option(argv, argv + argc, "-p")};
            min_period = std::stoi(user_min_period);
        }
        report_biggest_periods(repeats, sequence, max_report, min_period);
        int min_length {-1};
        if (cmd_option_exists(argv, argv + argc, "-l")) {
            const std::string user_min_length {get_cmd_option(argv, argv + argc, "-l")};
            min_length = std::stoi(user_min_length);
        }
        report_biggest_lengths(repeats, sequence, max_report, min_length);
    }
}